

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

green_future_t green_poller_pop(green_poller_t poller)

{
  green_future_t future;
  int iVar1;
  
  fwrite("green_poller_pop()\n",0x13,1,_stderr);
  if (poller != (green_poller_t)0x0) {
    green_poller_dump(poller);
    if ((poller->used != 0) && (poller->busy != poller->used)) {
      future = poller->futures[poller->busy];
      iVar1 = green_poller_rem(poller,future);
      if (iVar1 == 0) {
        return future;
      }
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","green_poller_rem(poller, f) == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x220);
      fflush(_stderr);
      abort();
    }
  }
  return (green_future_t)0x0;
}

Assistant:

green_future_t green_poller_pop(green_poller_t poller)
{
    fprintf(stderr, "green_poller_pop()\n");

    if (poller == NULL) {
        return NULL;
    }
    green_poller_dump(poller);
    if ((poller->used == 0) || (poller->busy == poller->used)) {
        return NULL;
    }
    green_future_t f = poller->futures[poller->busy];
    green_assert(green_poller_rem(poller, f) == 0);
    return f;
}